

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsModuleCompiler::SetupFunctionArguments
          (AsmJsModuleCompiler *this,AsmJsFunc *func,ParseNodePtr pnode)

{
  OpCode OVar1;
  int iVar2;
  bool bVar3;
  RegSlot RVar4;
  ParseNode *arg;
  IdentPtr name;
  IdentPtr arg_00;
  ParseNode *pPVar5;
  ParseNode *pPVar6;
  PropertyName pIVar7;
  ParseNodeInt *pPVar8;
  ParseNodeCall *pPVar9;
  IdentPtr pIVar10;
  AsmJsFunctionDeclaration *sym;
  char16_t *error;
  ArgSlot local_42;
  AsmJsFunc *pAStack_40;
  ArgSlot numArguments;
  int local_38;
  AsmJsVarType local_33;
  AsmJsVarType local_32;
  AsmJsVarType local_31;
  
  local_42 = 0;
  arg = ParserWrapper::FunctionArgsList(&func->mFncNode->super_ParseNode,&local_42);
  arg_00 = (IdentPtr)(ulong)local_42;
  bVar3 = AsmJsFunctionDeclaration::EnsureArgCount(&func->super_AsmJsFunctionDeclaration,local_42);
  if (bVar3) {
    local_38 = 0;
    pAStack_40 = func;
    while (arg != (ParseNode *)0x0) {
      if (pnode->nop != knopList) {
        error = L"Missing assignment statement for argument";
        goto LAB_00872438;
      }
      bVar3 = ParserWrapper::IsDefinition(arg);
      if (!bVar3) {
        error = L"duplicate argument name not allowed";
        goto LAB_00872438;
      }
      name = ParseNode::name(arg);
      bVar3 = AsmJSCompiler::CheckIdentifier(this,arg,name);
      if (!bVar3) goto LAB_0087243d;
      pIVar10 = name;
      arg_00 = (IdentPtr)AsmJsFunc::DefineVar(func,name,true,true);
      if (arg_00 == (IdentPtr)0x0) {
        error = L"Failed to define var";
        arg_00 = pIVar10;
        goto LAB_00872438;
      }
      pPVar5 = ParserWrapper::GetBinaryLeft(pnode);
      if (pPVar5->nop != knopAsg) {
        error = L"Expecting an assignment";
        arg_00 = pIVar10;
        goto LAB_00872438;
      }
      pPVar6 = ParserWrapper::GetBinaryLeft(pPVar5);
      pPVar5 = ParserWrapper::GetBinaryRight(pPVar5);
      if ((pPVar6->nop != knopName) ||
         (pIVar7 = ParserWrapper::VariableName(pPVar6),
         pIVar7->m_propertyId != *(int *)((long)&arg_00->m_pidRefStack->prev + 4))) {
LAB_0087244e:
        error = L"Defining wrong argument";
        arg_00 = pIVar10;
        goto LAB_00872438;
      }
      OVar1 = pPVar5->nop;
      if (OVar1 == knopCall) {
        pPVar9 = ParseNode::AsParseNodeCall(pPVar5);
        if (pPVar9->pnodeTarget->nop == knopName) {
          pIVar10 = ParseNode::name(pPVar9->pnodeTarget);
          sym = LookupIdentifier<Js::AsmJsFunctionDeclaration>(this,pIVar10);
          if (sym == (AsmJsFunctionDeclaration *)0x0) {
            error = L"Cannot resolve function for argument definition, or wrong function";
            arg_00 = pIVar10;
          }
          else if ((sym->super_AsmJsSymbol).mType == MathBuiltinFunction) {
            bVar3 = AsmJsMathFunction::IsFround(sym);
            if (bVar3) {
              pIVar10 = (IdentPtr)0x3;
              AsmJsVarType::AsmJsVarType(&local_31,Float);
              *(Which *)&arg_00->m_luHash = local_31.which_;
              RVar4 = AsmJsFunc::AcquireRegister<float>(pAStack_40);
              arg_00->m_cch = RVar4;
              if (pPVar9->argCount != 0) {
                pPVar5 = pPVar9->pnodeArgs;
                OVar1 = pPVar5->nop;
                goto joined_r0x008723a8;
              }
LAB_0087245a:
              error = L"Defining wrong argument";
              arg_00 = pIVar10;
            }
            else {
              error = L"call should be for fround";
              arg_00 = pIVar10;
            }
          }
          else {
            error = L"Wrong function used for argument definition";
            arg_00 = pIVar10;
          }
        }
        else {
          error = L"call should be for fround";
          arg_00 = pIVar10;
        }
        goto LAB_00872438;
      }
      if (OVar1 == knopOr) {
        pIVar10 = (IdentPtr)0x0;
        AsmJsVarType::AsmJsVarType(&local_32,Int);
        *(Which *)&arg_00->m_luHash = local_32.which_;
        RVar4 = AsmJsFunc::AcquireRegister<int>(pAStack_40);
        arg_00->m_cch = RVar4;
        pPVar6 = ParserWrapper::GetBinaryLeft(pPVar5);
        pPVar5 = ParserWrapper::GetBinaryRight(pPVar5);
        if ((pPVar6->nop != knopName) ||
           (pIVar7 = ParserWrapper::VariableName(pPVar6),
           pIVar7->m_propertyId != *(int *)((long)&arg_00->m_pidRefStack->prev + 4)))
        goto LAB_0087244e;
        if ((pPVar5->nop != knopInt) ||
           (pPVar8 = ParseNode::AsParseNodeInt(pPVar5), pPVar8->lw != 0)) {
          error = L"Or value must be 0 when defining arguments";
          arg_00 = pIVar10;
          goto LAB_00872438;
        }
      }
      else {
        if (OVar1 != knopPos) {
          error = L"arguments are not casted as valid Asm.js type";
          arg_00 = pIVar10;
          goto LAB_00872438;
        }
        pIVar10 = (IdentPtr)0x2;
        AsmJsVarType::AsmJsVarType(&local_33,Double);
        *(Which *)&arg_00->m_luHash = local_33.which_;
        RVar4 = AsmJsFunc::AcquireRegister<double>(pAStack_40);
        arg_00->m_cch = RVar4;
        pPVar5 = ParserWrapper::GetUnaryNode(pPVar5);
        OVar1 = pPVar5->nop;
joined_r0x008723a8:
        if ((OVar1 != knopName) ||
           (pIVar7 = ParserWrapper::VariableName(pPVar5),
           pIVar7->m_propertyId != *(int *)((long)&arg_00->m_pidRefStack->prev + 4)))
        goto LAB_0087245a;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,ByteCodePhase);
      if (bVar3) {
        Output::Print(L"    Argument [%s] Valid",&name->field_0x22);
      }
      iVar2 = local_38;
      func = pAStack_40;
      bVar3 = AsmJsFunctionDeclaration::EnsureArgType
                        (&pAStack_40->super_AsmJsFunctionDeclaration,(AsmJsVarBase *)arg_00,
                         (ArgSlot)local_38);
      if (!bVar3) {
        error = L"Unexpected argument type";
        goto LAB_00872438;
      }
      local_38 = iVar2 + 1;
      arg = ParserWrapper::NextVar(arg);
      pnode = ParserWrapper::GetBinaryRight(pnode);
    }
    func->mBodyNode = pnode;
    bVar3 = true;
  }
  else {
    error = L"Cannot have variable number of arguments";
LAB_00872438:
    Fail(this,(ParseNode *)arg_00,error);
LAB_0087243d:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AsmJsModuleCompiler::SetupFunctionArguments(AsmJsFunc * func, ParseNodePtr pnode)
    {
        // Check arguments
        ArgSlot numArguments = 0;
        ParseNode * fncNode = func->GetFncNode();
        ParseNode* argNode = ParserWrapper::FunctionArgsList(fncNode, numArguments);

        if (!func->EnsureArgCount(numArguments))
        {
            return Fail(argNode, _u("Cannot have variable number of arguments"));
        }

        ArgSlot index = 0;
        while (argNode)
        {
            if (pnode->nop != knopList)
            {
                return Fail(pnode, _u("Missing assignment statement for argument"));
            }


            if (!ParserWrapper::IsDefinition(argNode))
            {
                return Fail(argNode, _u("duplicate argument name not allowed"));
            }

            PropertyName argName = argNode->name();
            if (!AsmJSCompiler::CheckIdentifier(*this, argNode, argName))
            {
                return false;
            }

            // creates the variable
            AsmJsVarBase* var = func->DefineVar(argName, true);
            if (!var)
            {
                return Fail(argNode, _u("Failed to define var"));
            }

            ParseNode* argDefinition = ParserWrapper::GetBinaryLeft(pnode);
            if (argDefinition->nop != knopAsg)
            {
                return Fail(argDefinition, _u("Expecting an assignment"));
            }

            ParseNode* lhs = ParserWrapper::GetBinaryLeft(argDefinition);
            ParseNode* rhs = ParserWrapper::GetBinaryRight(argDefinition);

#define NodeDefineThisArgument(n,var) (n->nop == knopName && ParserWrapper::VariableName(n)->GetPropertyId() == var->GetName()->GetPropertyId())

            if (!NodeDefineThisArgument(lhs, var))
            {
                return Fail(lhs, _u("Defining wrong argument"));
            }

            if (rhs->nop == knopPos)
            {
                // unary + => double
                var->SetVarType(AsmJsVarType::Double);
                var->SetLocation(func->AcquireRegister<double>());
                // validate stmt
                ParseNode* argSym = ParserWrapper::GetUnaryNode(rhs);

                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else if (rhs->nop == knopOr)
            {
                var->SetVarType(AsmJsVarType::Int);
                var->SetLocation(func->AcquireRegister<int>());

                ParseNode* argSym = ParserWrapper::GetBinaryLeft(rhs);
                ParseNode* intSym = ParserWrapper::GetBinaryRight(rhs);
                // validate stmt
                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
                if (intSym->nop != knopInt || intSym->AsParseNodeInt()->lw != 0)
                {
                    return Fail(lhs, _u("Or value must be 0 when defining arguments"));
                }
            }
            else if (rhs->nop == knopCall)
            {
                ParseNodeCall* callNode = rhs->AsParseNodeCall();
                if (callNode->pnodeTarget->nop != knopName)
                {
                    return Fail(rhs, _u("call should be for fround"));
                }
                AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(callNode->pnodeTarget->name());

                if (!funcDecl)
                    return Fail(rhs, _u("Cannot resolve function for argument definition, or wrong function"));

                if (AsmJsMathFunction::Is(funcDecl))
                {
                    if (!AsmJsMathFunction::IsFround(funcDecl))
                    {
                        return Fail(rhs, _u("call should be for fround"));
                    }
                    var->SetVarType(AsmJsVarType::Float);
                    var->SetLocation(func->AcquireRegister<float>());
                }
                else
                {
                    return Fail(rhs, _u("Wrong function used for argument definition"));
                }

                if (callNode->argCount == 0 || !NodeDefineThisArgument(callNode->pnodeArgs, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else
            {
                return Fail(rhs, _u("arguments are not casted as valid Asm.js type"));
            }

            if (PHASE_TRACE1(ByteCodePhase))
            {
                Output::Print(_u("    Argument [%s] Valid"), argName->Psz());
            }

            if (!func->EnsureArgType(var, index++))
            {
                return Fail(rhs, _u("Unexpected argument type"));
            }

            argNode = ParserWrapper::NextVar(argNode);
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }

        func->SetBodyNode(pnode);
        return true;
    }